

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.hpp
# Opt level: O1

basic_endpoint<boost::asio::ip::udp> * __thiscall
libtorrent::detail::
read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char_const*&>
          (basic_endpoint<boost::asio::ip::udp> *__return_storage_ptr__,detail *this,char **in)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ushort port_num;
  uint uVar5;
  address addr;
  address local_28;
  
  lVar2 = *(long *)this + 1;
  uVar3 = 0;
  iVar4 = 4;
  do {
    uVar5 = uVar3 << 8;
    bVar1 = *(byte *)(lVar2 + -1);
    uVar3 = bVar1 | uVar5;
    *(long *)this = lVar2;
    lVar2 = lVar2 + 1;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  local_28.ipv4_address_.addr_.s_addr =
       (in4_addr_type)
       (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | (uint)bVar1 << 0x18);
  local_28.type_ = ipv4;
  local_28.ipv6_address_.addr_.__in6_u._0_8_ = 0;
  local_28.ipv6_address_.addr_.__in6_u._8_8_ = 0;
  local_28.ipv6_address_.scope_id_ = 0;
  iVar4 = 1;
  port_num = 0;
  do {
    port_num = (ushort)*(byte *)(lVar2 + -1) | port_num << 8;
    *(long *)this = lVar2;
    lVar2 = lVar2 + 1;
    iVar4 = iVar4 + -1;
  } while (iVar4 == 0);
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            (__return_storage_ptr__,&local_28,port_num);
  return __return_storage_ptr__;
}

Assistant:

Endpoint read_v4_endpoint(InIt&& in)
		{
			address addr = read_v4_address(in);
			std::uint16_t port = read_uint16(in);
			return Endpoint(addr, port);
		}